

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

bool __thiscall ON_SubDHeap::ReturnEdgeExtraArray(ON_SubDHeap *this,ON_SubDEdge *e)

{
  ON_SubDEdge *e_local;
  ON_SubDHeap *this_local;
  
  if (e == (ON_SubDEdge *)0x0) {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  else {
    if ((e->m_facex != (ON_SubDFacePtr *)0x0) || (e->m_facex_capacity != 0)) {
      ReturnArray(this,(ulong)e->m_facex_capacity,&e->m_facex->m_ptr);
      e->m_facex = (ON_SubDFacePtr *)0x0;
      e->m_facex_capacity = 0;
    }
    if (2 < e->m_face_count) {
      e->m_face_count = 2;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDHeap::ReturnEdgeExtraArray(
  ON_SubDEdge* e
  )
{
  if ( nullptr == e )
    return ON_SUBD_RETURN_ERROR(false);
  if (nullptr != e->m_facex || e->m_facex_capacity > 0)
  {
    ReturnArray(e->m_facex_capacity,(ON__UINT_PTR*)e->m_facex);
    e->m_facex = nullptr;
    e->m_facex_capacity = 0;
  }
  if (e->m_face_count > 2)
    e->m_face_count = 2;
  return true;
}